

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O1

UINT8 device_start_c352(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT8 UVar1;
  C352 *c;
  DEV_DATA DVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  short sVar6;
  short sVar7;
  
  DVar2.chipInf = calloc(1,0x6a8);
  if (DVar2.chipInf == (void *)0x0) {
    UVar1 = 0xff;
  }
  else {
    ((DEV_DATA *)((long)DVar2.chipInf + 0x490))->chipInf = (void *)0x0;
    *(undefined4 *)&((DEV_DATA *)((long)DVar2.chipInf + 0x498))->chipInf = 0;
    uVar3 = cfg->clock / 0x120;
    *(uint *)&((DEV_DATA *)((long)DVar2.chipInf + 8))->chipInf = uVar3;
    *(UINT8 *)&((DEV_DATA *)((long)DVar2.chipInf + 0x4a0))->chipInf = cfg->flags;
    lVar4 = 0x2c;
    do {
      *(undefined1 *)((long)DVar2.chipInf + lVar4) = 0;
      lVar4 = lVar4 + 0x24;
    } while (lVar4 != 0x4ac);
    uVar5 = 0;
    sVar6 = 0;
    do {
      *(short *)((long)DVar2.chipInf + uVar5 * 2 + 0x4a2) = sVar6 << 5;
      sVar7 = 1;
      if (((0xf < uVar5) && (sVar7 = 2, 0x17 < uVar5)) && (sVar7 = 4, 0x2f < uVar5)) {
        sVar7 = (ushort)(99 < uVar5) * 8 + 8;
      }
      sVar6 = sVar6 + sVar7;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x80);
    lVar4 = 0x2d1;
    do {
      *(ushort *)((long)DVar2.chipInf + lVar4 * 2) =
           ~*(ushort *)((long)DVar2.chipInf + lVar4 * 2 + -0x100) & 0xffe0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x351);
    *(void **)DVar2.chipInf = DVar2.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
    retDevInf->sampleRate = uVar3;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

static UINT8 device_start_c352(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	C352 *c;
	int i;
	INT16 j;

	c = (C352 *)calloc(1, sizeof(C352));
	if (c == NULL)
		return 0xFF;

	c->wave = NULL;
	c->wavesize = 0x00;

	//c->sample_rate_base = cfg->clock / 576;	// sample rate according to superctr
	c->sample_rate_base = cfg->clock / 288;	// TODO: output at 43 KHz and fix sample reading/interpolation code
	c->muteRear = cfg->flags;

	//device_reset_c352(c);

	c352_set_mute_mask(c, 0x00000000);
	
	j=0;
	for(i=0;i<128;i++)
	{
		c->mulaw_table[i] = j<<5;
		if(i < 16)
			j += 1;
		else if(i < 24)
			j += 2;
		else if(i < 48)
			j += 4;
		else if(i < 100)
			j += 8;
		else
			j += 16;
	}
	for(i=128;i<256;i++)
		c->mulaw_table[i] = (~c->mulaw_table[i-128])&~0x1f;

	c->_devData.chipInf = c;
	INIT_DEVINF(retDevInf, &c->_devData, c->sample_rate_base, &devDef);
	return 0x00;
}